

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3VListNumToName(VList *pIn,int iVal)

{
  int *piVar1;
  int iVar2;
  
  if (pIn != (VList *)0x0) {
    iVar2 = 2;
    do {
      piVar1 = pIn + iVar2;
      if (*piVar1 == iVal) {
        return (char *)(piVar1 + 2);
      }
      iVar2 = iVar2 + piVar1[1];
    } while (iVar2 < pIn[1]);
  }
  return (char *)0x0;
}

Assistant:

SQLITE_PRIVATE const char *sqlite3VListNumToName(VList *pIn, int iVal){
  int i, mx;
  if( pIn==0 ) return 0;
  mx = pIn[1];
  i = 2;
  do{
    if( pIn[i]==iVal ) return (char*)&pIn[i+2];
    i += pIn[i+1];
  }while( i<mx );
  return 0;
}